

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O2

void setMarks(void)

{
  ostream *poVar1;
  initializer_list<double> __l;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> temp;
  double local_48 [5];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_20;
  
  local_48[2] = 3.0;
  local_48[3] = 2.0;
  local_48[0] = 1.0;
  local_48[1] = 4.0;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector(&temp,__l,&local_61);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&temp);
  local_48[2] = 5.0;
  local_48[3] = 6.0;
  local_48[0] = 4.0;
  local_48[1] = 2.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&temp,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&temp);
  local_48[2] = 4.0;
  local_48[3] = 5.0;
  local_48[0] = 3.0;
  local_48[1] = 8.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&temp,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&temp);
  local_48[2] = 7.0;
  local_48[3] = 8.0;
  local_48[0] = 9.0;
  local_48[1] = 5.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&temp,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&temp);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
  poVar1 = std::operator<<(poVar1,"MATRIX ASSESSMENTS");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_20,&marks);
  printMatrix(&local_20);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_20);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temp.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void setMarks(){
    //Suzuki
    vector<double> temp={1,4,3,2};
    marks.push_back(temp);
    //Mitsubishi
    temp={4,2,5,6};
    marks.push_back(temp);
    //Honda
    temp={3,8,4,5};
    marks.push_back(temp);
    //Toyota
    temp={9,5,7,8};
    marks.push_back(temp);

    cout << endl << setw(10) << "MATRIX ASSESSMENTS" << endl;
    printMatrix(marks);
}